

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateBase.cpp
# Opt level: O3

ShaderResourceVariableDesc
Diligent::FindPipelineResourceLayoutVariable
          (PipelineResourceLayoutDesc *LayoutDesc,char *Name,SHADER_TYPE ShaderStage,
          char *CombinedSamplerSuffix)

{
  ShaderResourceVariableDesc *pSVar1;
  SHADER_TYPE SVar2;
  bool bVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  ShaderResourceVariableDesc SVar8;
  string msg;
  string local_50;
  
  uVar4 = (ulong)LayoutDesc->NumVariables;
  if (LayoutDesc->NumVariables != 0) {
    lVar5 = 0x18;
    uVar6 = 1;
    do {
      pSVar1 = LayoutDesc->Variables;
      if ((*(SHADER_TYPE *)((long)&pSVar1[-1].Name + lVar5) & ShaderStage) != SHADER_TYPE_UNKNOWN) {
        bVar3 = StreqSuff(Name,*(char **)((long)pSVar1 + lVar5 + -0x18),CombinedSamplerSuffix,false)
        ;
        uVar4 = (ulong)LayoutDesc->NumVariables;
        if (bVar3) {
          lVar7 = lVar5;
          if ((uint)uVar6 < LayoutDesc->NumVariables) {
            do {
              if (((*(SHADER_TYPE *)((long)&LayoutDesc->Variables->Name + lVar7) & ShaderStage) !=
                   SHADER_TYPE_UNKNOWN) &&
                 (bVar3 = StreqSuff(Name,*(char **)((long)LayoutDesc->Variables + lVar7 + -8),
                                    CombinedSamplerSuffix,false), bVar3)) {
                FormatString<char[149]>
                          (&local_50,
                           (char (*) [149])
                           "There must be no variables with overlapping stages in Desc.ResourceLayout. This error should\'ve been caught by ValidatePipelineResourceLayoutDesc()."
                          );
                DebugAssertionFailed
                          (local_50._M_dataplus._M_p,"FindPipelineResourceLayoutVariable",
                           "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                           ,0x39c);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_50._M_dataplus._M_p != &local_50.field_2) {
                  operator_delete(local_50._M_dataplus._M_p,
                                  local_50.field_2._M_allocated_capacity + 1);
                }
              }
              uVar6 = uVar6 + 1;
              lVar7 = lVar7 + 0x10;
            } while (uVar6 < LayoutDesc->NumVariables);
          }
          Name = *(char **)((long)pSVar1 + lVar5 + -0x18);
          uVar4 = *(ulong *)((long)&pSVar1[-1].Name + lVar5);
          goto LAB_006ac924;
        }
      }
      lVar5 = lVar5 + 0x10;
      bVar3 = uVar6 < uVar4;
      uVar6 = uVar6 + 1;
    } while (bVar3);
  }
  SVar2 = LayoutDesc->DefaultVariableMergeStages;
  if ((LayoutDesc->DefaultVariableMergeStages & ShaderStage) == SHADER_TYPE_UNKNOWN) {
    SVar2 = ShaderStage;
  }
  uVar4 = (ulong)CONCAT14(LayoutDesc->DefaultVariableType,SVar2);
LAB_006ac924:
  SVar8.ShaderStages = (int)uVar4;
  SVar8.Type = (char)(uVar4 >> 0x20);
  SVar8.Flags = (char)(uVar4 >> 0x28);
  SVar8._14_2_ = (short)(uVar4 >> 0x30);
  SVar8.Name = Name;
  return SVar8;
}

Assistant:

ShaderResourceVariableDesc FindPipelineResourceLayoutVariable(
    const PipelineResourceLayoutDesc& LayoutDesc,
    const char*                       Name,
    SHADER_TYPE                       ShaderStage,
    const char*                       CombinedSamplerSuffix)
{
    for (Uint32 i = 0; i < LayoutDesc.NumVariables; ++i)
    {
        const ShaderResourceVariableDesc& Var = LayoutDesc.Variables[i];
        if ((Var.ShaderStages & ShaderStage) != 0 && StreqSuff(Name, Var.Name, CombinedSamplerSuffix))
        {
#ifdef DILIGENT_DEBUG
            for (Uint32 j = i + 1; j < LayoutDesc.NumVariables; ++j)
            {
                const ShaderResourceVariableDesc& Var2 = LayoutDesc.Variables[j];
                VERIFY(!((Var2.ShaderStages & ShaderStage) != 0 && StreqSuff(Name, Var2.Name, CombinedSamplerSuffix)),
                       "There must be no variables with overlapping stages in Desc.ResourceLayout. "
                       "This error should've been caught by ValidatePipelineResourceLayoutDesc().");
            }
#endif
            return Var;
        }
    }

    // Use default properties
    if (ShaderStage & LayoutDesc.DefaultVariableMergeStages)
        ShaderStage = LayoutDesc.DefaultVariableMergeStages;
    return {ShaderStage, Name, LayoutDesc.DefaultVariableType};
}